

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeAverageSectionParameters
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  element_type *peVar17;
  undefined1 auVar19 [16];
  element_type *peVar18;
  undefined1 auVar20 [64];
  undefined8 uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double mv1;
  double mv1_00;
  double mv1_01;
  double mv1_02;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  double dVar33;
  double dVar34;
  double mv2;
  double mv2_00;
  double mv2_01;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double mv2_02;
  double mv2_03;
  double mv2_04;
  double mv2_05;
  double dVar39;
  double dVar40;
  undefined8 extraout_XMM0_Qb_10;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar44 [64];
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  undefined8 extraout_XMM0_Qb_07;
  undefined8 extraout_XMM0_Qb_08;
  undefined8 extraout_XMM0_Qb_09;
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  double Qmz2;
  double Qmy2;
  double Jmyz2;
  double Jmzz2;
  double Jmyy2;
  double mass_phi2;
  double Qmz1;
  double Qmy1;
  double Jmyz1;
  double Jmzz1;
  double Jmyy1;
  double mass_phi1;
  DampingCoefficients rdamping_coeff2;
  DampingCoefficients rdamping_coeff1;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [64];
  double local_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  ulong local_88;
  double local_80;
  double dStack_78;
  double dStack_70;
  double dStack_68;
  ulong local_60;
  undefined1 local_58 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  if (this->compute_ave_sec_par == false) {
    uVar21 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x58))();
    dVar22 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x178))();
    dVar23 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x180))();
    dVar24 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x188))();
    dVar25 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 400))();
    dVar26 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x198))();
    dVar27 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x10))();
    dVar28 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x18))();
    mv1 = (double)(**(code **)((long)(((this->sectionA).
                                       super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                     super_ChBeamSectionEulerAdvancedGeneric.
                                     super_ChBeamSectionEuler.super_ChBeamSection.
                                     _vptr_ChBeamSection + 0x20))();
    mv1_00 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x28))();
    mv1_01 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x138))();
    mv1_02 = (double)(**(code **)((long)(((this->sectionA).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x140))();
    uVar29 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x30))();
    uVar30 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x38))();
    uVar31 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x40))();
    uVar32 = (**(code **)((long)(((this->sectionA).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x48))();
    auVar44._0_8_ =
         (**(code **)((long)(((this->sectionA).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                            super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                            super_ChBeamSection._vptr_ChBeamSection + 0x50))();
    auVar44._8_56_ = extraout_var;
    auVar2._8_8_ = extraout_XMM0_Qb;
    auVar2._0_8_ = uVar21;
    auVar6._8_8_ = extraout_XMM0_Qb_01;
    auVar6._0_8_ = uVar30;
    auVar4._8_8_ = extraout_XMM0_Qb_03;
    auVar4._0_8_ = uVar32;
    peVar18 = (this->sectionA).
              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    auVar7._8_8_ = extraout_XMM0_Qb_00;
    auVar7._0_8_ = uVar29;
    auVar1 = vunpcklpd_avx(auVar2,auVar7);
    auVar5._8_8_ = extraout_XMM0_Qb_02;
    auVar5._0_8_ = uVar31;
    auVar2 = vunpcklpd_avx(auVar6,auVar5);
    auVar19 = vmovlhps_avx(auVar4,auVar44._0_16_);
    auVar20 = vinsertf32x4_avx512f(ZEXT3264(CONCAT1616(auVar2,auVar1)),auVar19,2);
    auVar19._0_8_ =
         (peVar18->super_ChBeamSectionRayleighAdvancedGeneric).
         super_ChBeamSectionEulerAdvancedGeneric.Byy;
    auVar19._8_8_ =
         (peVar18->super_ChBeamSectionRayleighAdvancedGeneric).
         super_ChBeamSectionEulerAdvancedGeneric.Bzz;
    local_e8 = vinsertf32x4_avx512f(auVar20,auVar19,3);
    (**(code **)((long)(peVar18->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x168))
              (peVar18,&local_118,&local_120,&local_128,&local_110,&local_130,&local_138);
    dVar33 = cos(local_110);
    dVar34 = sin(local_110);
    (**(code **)((long)(((this->sectionA).
                         super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x150))(&local_80);
    local_f8 = (**(code **)((long)(((this->sectionA).
                                    super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                  super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                  super_ChBeamSection._vptr_ChBeamSection + 0x1a8))();
    uStack_f0 = extraout_XMM0_Qb_04;
    uVar21 = (**(code **)((long)(((this->sectionB).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x58))();
    mv2 = (double)(**(code **)((long)(((this->sectionB).
                                       super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                     super_ChBeamSectionEulerAdvancedGeneric.
                                     super_ChBeamSectionEuler.super_ChBeamSection.
                                     _vptr_ChBeamSection + 0x178))();
    mv2_00 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x180))();
    mv2_01 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x188))();
    dVar35 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 400))();
    dVar36 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x198))();
    dVar37 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x10))();
    dVar38 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x18))();
    mv2_02 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x20))();
    mv2_03 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x28))();
    mv2_04 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x138))();
    mv2_05 = (double)(**(code **)((long)(((this->sectionB).
                                          super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                        super_ChBeamSectionEulerAdvancedGeneric.
                                        super_ChBeamSectionEuler.super_ChBeamSection.
                                        _vptr_ChBeamSection + 0x140))();
    uVar29 = (**(code **)((long)(((this->sectionB).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x30))();
    uVar30 = (**(code **)((long)(((this->sectionB).
                                  super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x38))();
    local_58._0_8_ =
         (**(code **)((long)(((this->sectionB).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                            super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                            super_ChBeamSection._vptr_ChBeamSection + 0x40))();
    local_58._8_8_ = extraout_XMM0_Qb_08;
    local_108 = (**(code **)((long)(((this->sectionB).
                                     super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                   super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                   super_ChBeamSection._vptr_ChBeamSection + 0x48))();
    uStack_100 = extraout_XMM0_Qb_09;
    auVar45._0_8_ =
         (**(code **)((long)(((this->sectionB).
                              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                            super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                            super_ChBeamSection._vptr_ChBeamSection + 0x50))();
    auVar45._8_56_ = extraout_var_00;
    auVar3._8_8_ = extraout_XMM0_Qb_05;
    auVar3._0_8_ = uVar21;
    auVar12._8_8_ = extraout_XMM0_Qb_07;
    auVar12._0_8_ = uVar30;
    auVar15._8_8_ = uStack_100;
    auVar15._0_8_ = local_108;
    peVar18 = (this->sectionB).
              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    auVar13._8_8_ = extraout_XMM0_Qb_06;
    auVar13._0_8_ = uVar29;
    auVar19 = vunpcklpd_avx(auVar3,auVar13);
    auVar1 = vunpcklpd_avx(auVar12,local_58._0_16_);
    auVar2 = vunpcklpd_avx(auVar15,auVar45._0_16_);
    auVar20 = vinsertf32x4_avx512f(ZEXT3264(CONCAT1616(auVar1,auVar19)),auVar2,2);
    auVar1._0_8_ = (peVar18->super_ChBeamSectionRayleighAdvancedGeneric).
                   super_ChBeamSectionEulerAdvancedGeneric.Byy;
    auVar1._8_8_ = (peVar18->super_ChBeamSectionRayleighAdvancedGeneric).
                   super_ChBeamSectionEulerAdvancedGeneric.Bzz;
    auVar20 = vinsertf32x4_avx512f(auVar20,auVar1,3);
    local_58 = vaddpd_avx512f(auVar20,local_e8);
    (**(code **)((long)(peVar18->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x168))
              (peVar18,&local_148,&local_150,&local_158,&local_140,&local_160,&local_168);
    dVar39 = cos(local_140);
    local_e8._0_8_ = dVar39;
    dVar40 = sin(local_140);
    (**(code **)((long)(((this->sectionB).
                         super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                       super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                       super_ChBeamSection._vptr_ChBeamSection + 0x150))(&local_a8);
    peVar18 = (this->sectionB).
              super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    uVar21 = (**(code **)((long)(peVar18->super_ChBeamSectionRayleighAdvancedGeneric).
                                super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                                super_ChBeamSection._vptr_ChBeamSection + 0x1a8))();
    dVar39 = this->length;
    peVar17 = (this->avg_sec_par).
              super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    auVar20._8_8_ = 0x3fe0000000000000;
    auVar20._0_8_ = 0x3fe0000000000000;
    auVar20._16_8_ = 0x3fe0000000000000;
    auVar20._24_8_ = 0x3fe0000000000000;
    auVar20._32_8_ = 0x3fe0000000000000;
    auVar20._40_8_ = 0x3fe0000000000000;
    auVar20._48_8_ = 0x3fe0000000000000;
    auVar20._56_8_ = 0x3fe0000000000000;
    auVar20 = vmulpd_avx512f(local_58,auVar20);
    peVar17->mu = (double)auVar20._0_8_;
    peVar17->alpha = (double)auVar20._8_8_;
    peVar17->Cy = (double)auVar20._16_8_;
    peVar17->Cz = (double)auVar20._24_8_;
    peVar17->Sy = (double)auVar20._32_8_;
    peVar17->Sz = (double)auVar20._40_8_;
    peVar17->My = (double)auVar20._48_8_;
    peVar17->Mz = (double)auVar20._56_8_;
    dVar22 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)peVar18,dVar22,mv2);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Jyy = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)peVar18,dVar23,mv2_00);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Jzz = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)peVar18,dVar24,mv2_01);
    peVar17 = (this->avg_sec_par).
              super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    peVar17->Jyz = dVar22;
    peVar17->Jxx = peVar17->Jyy + peVar17->Jzz;
    if (0.0 <= dVar35 * dVar25) {
      dVar22 = pow(dVar35 * dVar25,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar22 = (dVar22 + dVar25 + dVar35) / 3.0;
    }
    else {
      dVar22 = (dVar35 + dVar25) * 0.5;
    }
    peVar17->Qy = dVar22;
    if (0.0 <= dVar26 * dVar36) {
      dVar22 = pow(dVar26 * dVar36,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar22 = (dVar22 + dVar26 + dVar36) / 3.0;
    }
    else {
      dVar22 = (dVar26 + dVar36) * 0.5;
    }
    peVar17->Qz = dVar22;
    peVar17->mass_phi = (local_110 + local_140) * 0.5;
    dVar22 = anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)peVar18,local_118,local_148);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Jmyy = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)peVar18,local_120,local_150);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    Jmzz = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)peVar18,local_128,local_158);
    peVar17 = (this->avg_sec_par).
              super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    peVar17->Jmyz = dVar22;
    peVar17->Jmxx = peVar17->Jmyy + peVar17->Jmzz;
    if (0.0 <= local_130 * local_160) {
      dVar22 = pow(local_130 * local_160,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar22 = (dVar22 + local_130 + local_160) / 3.0;
    }
    else {
      dVar22 = (local_130 + local_160) * 0.5;
    }
    peVar17->Qmy = dVar22;
    if (0.0 <= local_138 * local_168) {
      dVar22 = pow(local_138 * local_168,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar22 = (dVar22 + local_138 + local_168) / 3.0;
    }
    else {
      dVar22 = (local_138 + local_168) * 0.5;
    }
    peVar17->Qmz = dVar22;
    dVar22 = mv2_03 * (double)local_e8._0_8_;
    dVar23 = mv2_05 * (double)local_e8._0_8_;
    if (0.0 <= dVar27 * dVar37) {
      dVar24 = pow(dVar27 * dVar37,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar24 = (dVar24 + dVar27 + dVar37) / 3.0;
    }
    else {
      dVar24 = (dVar27 + dVar37) * 0.5;
    }
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar23;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = dVar40 * mv2_05;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = dVar22;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar40 * mv2_03;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = mv1_02 * dVar33;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = mv1_02 * dVar34;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = mv1_00 * dVar33;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = mv1_00 * dVar34;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = mv1;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar33;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar34;
    peVar17->EA = dVar24;
    auVar19 = vfmadd231sd_fma(auVar59,auVar46,auVar52);
    auVar4 = vfnmadd231sd_fma(auVar57,auVar55,auVar46);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = mv1_01;
    auVar1 = vfmadd231sd_fma(auVar63,auVar47,auVar52);
    auVar5 = vfnmadd231sd_fma(auVar61,auVar47,auVar55);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = mv2_02;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_e8._0_8_;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar40;
    auVar2 = vfmadd231sd_fma(auVar60,auVar48,auVar53);
    auVar6 = vfnmadd231sd_fma(auVar58,auVar56,auVar48);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = mv2_04;
    auVar3 = vfmadd231sd_fma(auVar64,auVar49,auVar53);
    auVar7 = vfnmadd231sd_fma(auVar62,auVar49,auVar56);
    if (0.0 <= dVar28 * dVar38) {
      dVar22 = pow(dVar28 * dVar38,0.5);
      peVar17 = (this->avg_sec_par).
                super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      dVar22 = (dVar22 + dVar28 + dVar38) / 3.0;
    }
    else {
      dVar22 = (dVar28 + dVar38) * 0.5;
    }
    peVar17->GJ = dVar22;
    dVar39 = dVar39 * dVar39;
    dVar22 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)peVar18,mv1_01,mv2_04);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GAyy = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)peVar18,mv1_02,mv2_05);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GAzz = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)peVar18,mv1,mv2_02);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    EIyy = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)peVar18,mv1_00,mv2_03);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    EIzz = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)peVar18,auVar1._0_8_,auVar3._0_8_);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GAmyy = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)peVar18,auVar5._0_8_,auVar7._0_8_);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    GAmzz = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)peVar18,auVar19._0_8_,auVar2._0_8_);
    ((this->avg_sec_par).
     super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    EImyy = dVar22;
    dVar22 = anon_class_1_0_00000001::operator()
                       ((anon_class_1_0_00000001 *)peVar18,auVar4._0_8_,auVar6._0_8_);
    peVar17 = (this->avg_sec_par).
              super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    peVar17->EImzz = dVar22;
    (peVar17->rdamping_coeff).bx = (local_80 + local_a8) * 0.5;
    (peVar17->rdamping_coeff).by = (dStack_78 + dStack_a0) * 0.5;
    (peVar17->rdamping_coeff).bz = (dStack_70 + dStack_98) * 0.5;
    (peVar17->rdamping_coeff).bt = (dStack_68 + dStack_90) * 0.5;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_60;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_88;
    auVar16._8_8_ = uStack_f0;
    auVar16._0_8_ = local_f8;
    auVar19 = vunpcklpd_avx(auVar50,auVar16);
    auVar14._8_8_ = extraout_XMM0_Qb_10;
    auVar14._0_8_ = uVar21;
    auVar1 = vunpcklpd_avx(auVar54,auVar14);
    (peVar17->rdamping_coeff).alpha = (auVar19._0_8_ + auVar1._0_8_) * 0.5;
    peVar17->artificial_factor_for_shear_damping = (auVar19._8_8_ + auVar1._8_8_) * 0.5;
    peVar17->phimy = 0.0;
    peVar17->phimz = 0.0;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = peVar17->GAmyy;
    auVar8._8_8_ = 0x7fffffffffffffff;
    auVar8._0_8_ = 0x7fffffffffffffff;
    auVar19 = vandpd_avx512vl(auVar51,auVar8);
    if (0.01 < auVar19._0_8_) {
      peVar17->phimy = (dVar22 * 12.0) / (dVar39 * peVar17->GAmyy);
    }
    auVar41._8_8_ = 0;
    auVar41._0_8_ = peVar17->GAmzz;
    auVar9._8_8_ = 0x7fffffffffffffff;
    auVar9._0_8_ = 0x7fffffffffffffff;
    auVar19 = vandpd_avx512vl(auVar41,auVar9);
    if (0.01 < auVar19._0_8_) {
      peVar17->phimz = (peVar17->EImyy * 12.0) / (dVar39 * peVar17->GAmzz);
    }
    peVar17->phiy = 0.0;
    peVar17->phiz = 0.0;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = peVar17->GAyy;
    auVar10._8_8_ = 0x7fffffffffffffff;
    auVar10._0_8_ = 0x7fffffffffffffff;
    auVar19 = vandpd_avx512vl(auVar42,auVar10);
    if (0.01 < auVar19._0_8_) {
      peVar17->phiy = (peVar17->EIzz * 12.0) / (dVar39 * peVar17->GAyy);
    }
    auVar43._8_8_ = 0;
    auVar43._0_8_ = peVar17->GAzz;
    auVar11._8_8_ = 0x7fffffffffffffff;
    auVar11._0_8_ = 0x7fffffffffffffff;
    auVar19 = vandpd_avx512vl(auVar43,auVar11);
    if (0.01 < auVar19._0_8_) {
      peVar17->phiz = (peVar17->EIyy * 12.0) / (dVar39 * peVar17->GAzz);
    }
    this->compute_ave_sec_par = true;
  }
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeAverageSectionParameters() {
    if (compute_ave_sec_par) {
        return;
    }

    double mu1 = this->sectionA->GetMassPerUnitLength();
    // double Jxx1 = this->sectionA->GetInertiaJxxPerUnitLength();
    double Jyy1 = this->sectionA->GetInertiaJyyPerUnitLength();
    double Jzz1 = this->sectionA->GetInertiaJzzPerUnitLength();
    double Jyz1 = this->sectionA->GetInertiaJyzPerUnitLength();
    double Qy1 = this->sectionA->GetInertiaQyPerUnitLength();
    double Qz1 = this->sectionA->GetInertiaQzPerUnitLength();
    // double Jmxx1 = this->sectionA->GetInertiaJxxPerUnitLengthInMassReference();
    double EA1 = this->sectionA->GetAxialRigidity();
    double GJ1 = this->sectionA->GetXtorsionRigidity();
    double EIyy1 = this->sectionA->GetYbendingRigidity();
    double EIzz1 = this->sectionA->GetZbendingRigidity();
    double GAyy1 = this->sectionA->GetYshearRigidity();
    double GAzz1 = this->sectionA->GetZshearRigidity();
    double alpha1 = this->sectionA->GetSectionRotation();
    double Cy1 = this->sectionA->GetCentroidY();
    double Cz1 = this->sectionA->GetCentroidZ();
    double Sy1 = this->sectionA->GetShearCenterY();
    double Sz1 = this->sectionA->GetShearCenterZ();
    double My1 = this->sectionA->GetCenterOfMassY();
    double Mz1 = this->sectionA->GetCenterOfMassZ();
    double mass_phi1;
    double Jmyy1;
    double Jmzz1;
    double Jmyz1;
    double Qmy1;
    double Qmz1;
    this->sectionA->GetMainInertiasInMassReference(Jmyy1, Jmzz1, Jmyz1, mass_phi1, Qmy1, Qmz1);
    // double Jmxx1 = Jmyy1 + Jmzz1;
    // rotate the bending and shear stiffnesses from elastic axis to mass axis
    double cosphi1 = cos(mass_phi1);
    double sinphi1 = sin(mass_phi1);
    double EImyy1 = EIyy1 * cosphi1 + EIzz1 * sinphi1;
    double EImzz1 = -EIyy1 * sinphi1 + EIzz1 * cosphi1;
    double GAmyy1 = GAyy1 * cosphi1 + GAzz1 * sinphi1;
    double GAmzz1 = -GAyy1 * sinphi1 + GAzz1 * cosphi1;
    DampingCoefficients rdamping_coeff1 = this->sectionA->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping1 = this->sectionA->GetArtificialFactorForShearDamping();

    double mu2 = this->sectionB->GetMassPerUnitLength();
    // double Jxx2 = this->sectionB->GetInertiaJxxPerUnitLength();
    double Jyy2 = this->sectionB->GetInertiaJyyPerUnitLength();
    double Jzz2 = this->sectionB->GetInertiaJzzPerUnitLength();
    double Jyz2 = this->sectionB->GetInertiaJyzPerUnitLength();
    double Qy2 = this->sectionB->GetInertiaQyPerUnitLength();
    double Qz2 = this->sectionB->GetInertiaQzPerUnitLength();
    // double Jmxx2 = this->sectionB->GetInertiaJxxPerUnitLengthInMassReference();
    double EA2 = this->sectionB->GetAxialRigidity();
    double GJ2 = this->sectionB->GetXtorsionRigidity();
    double EIyy2 = this->sectionB->GetYbendingRigidity();
    double EIzz2 = this->sectionB->GetZbendingRigidity();
    double GAyy2 = this->sectionB->GetYshearRigidity();
    double GAzz2 = this->sectionB->GetZshearRigidity();
    double alpha2 = this->sectionB->GetSectionRotation();
    double Cy2 = this->sectionB->GetCentroidY();
    double Cz2 = this->sectionB->GetCentroidZ();
    double Sy2 = this->sectionB->GetShearCenterY();
    double Sz2 = this->sectionB->GetShearCenterZ();
    double My2 = this->sectionB->GetCenterOfMassY();
    double Mz2 = this->sectionB->GetCenterOfMassZ();
    double mass_phi2;
    double Jmyy2;
    double Jmzz2;
    double Jmyz2;
    double Qmy2;
    double Qmz2;
    this->sectionB->GetMainInertiasInMassReference(Jmyy2, Jmzz2, Jmyz2, mass_phi2, Qmy2, Qmz2);
    // double Jmxx2 = Jmyy2 + Jmzz2;
    // rotate the bending and shear stiffnesses from elastic axis to mass axis
    double cosphi2 = cos(mass_phi2);
    double sinphi2 = sin(mass_phi2);
    double EImyy2 = EIyy2 * cosphi2 + EIzz2 * sinphi2;
    double EImzz2 = -EIyy2 * sinphi2 + EIzz2 * cosphi2;
    double GAmyy2 = GAyy2 * cosphi2 + GAzz2 * sinphi2;
    double GAmzz2 = -GAyy2 * sinphi2 + GAzz2 * cosphi2;
    DampingCoefficients rdamping_coeff2 = this->sectionB->GetBeamRaleyghDamping();
    double artificial_factor_for_shear_damping2 = this->sectionB->GetArtificialFactorForShearDamping();

    double L = this->GetLength();
    double LL = L * L;

    this->avg_sec_par->mu = GetAverageValue(mu1, mu2);
    this->avg_sec_par->alpha = GetAverageValue(alpha1, alpha2);
    this->avg_sec_par->Cy = GetAverageValue(Cy1, Cy2);
    this->avg_sec_par->Cz = GetAverageValue(Cz1, Cz2);
    this->avg_sec_par->Sy = GetAverageValue(Sy1, Sy2);
    this->avg_sec_par->Sz = GetAverageValue(Sz1, Sz2);
    this->avg_sec_par->My = GetAverageValue(My1, My2);
    this->avg_sec_par->Mz = GetAverageValue(Mz1, Mz2);

    this->avg_sec_par->Jyy = GetAverageValue5(Jyy1, Jyy2);
    this->avg_sec_par->Jzz = GetAverageValue5(Jzz1, Jzz2);
    this->avg_sec_par->Jyz = GetAverageValue5(Jyz1, Jyz2);  // Jyz may be negative
    this->avg_sec_par->Jxx = this->avg_sec_par->Jyy + this->avg_sec_par->Jzz;
    this->avg_sec_par->Qy = GetAverageValue3(Qy1, Qy2);  // Qy may be negative
    this->avg_sec_par->Qz = GetAverageValue3(Qz1, Qz2);  // Qz may be negative

    this->avg_sec_par->mass_phi = GetAverageValue(mass_phi1, mass_phi2);
    this->avg_sec_par->Jmyy = GetAverageValue5(Jmyy1, Jmyy2);
    this->avg_sec_par->Jmzz = GetAverageValue5(Jmzz1, Jmzz2);
    this->avg_sec_par->Jmyz = GetAverageValue5(Jmyz1, Jmyz2);  // Jyz may be negative
    this->avg_sec_par->Jmxx = this->avg_sec_par->Jmyy + this->avg_sec_par->Jmzz;
    this->avg_sec_par->Qmy = GetAverageValue3(Qmy1, Qmy2);  // Qy may be negative
    this->avg_sec_par->Qmz = GetAverageValue3(Qmz1, Qmz2);  // Qz may be negative

    this->avg_sec_par->EA = GetAverageValue3(EA1, EA2);
    this->avg_sec_par->GJ = GetAverageValue3(GJ1, GJ2);
    this->avg_sec_par->GAyy = GetAverageValue5(GAyy1, GAyy2);
    this->avg_sec_par->GAzz = GetAverageValue5(GAzz1, GAzz2);
    this->avg_sec_par->EIyy = GetAverageValue5(EIyy1, EIyy2);
    this->avg_sec_par->EIzz = GetAverageValue5(EIzz1, EIzz2);

    this->avg_sec_par->GAmyy = GetAverageValue5(GAmyy1, GAmyy2);
    this->avg_sec_par->GAmzz = GetAverageValue5(GAmzz1, GAmzz2);
    this->avg_sec_par->EImyy = GetAverageValue5(EImyy1, EImyy2);
    this->avg_sec_par->EImzz = GetAverageValue5(EImzz1, EImzz2);

    this->avg_sec_par->rdamping_coeff.bx = GetAverageValue(rdamping_coeff1.bx, rdamping_coeff2.bx);
    this->avg_sec_par->rdamping_coeff.by = GetAverageValue(rdamping_coeff1.by, rdamping_coeff2.by);
    this->avg_sec_par->rdamping_coeff.bz = GetAverageValue(rdamping_coeff1.bz, rdamping_coeff2.bz);
    this->avg_sec_par->rdamping_coeff.bt = GetAverageValue(rdamping_coeff1.bt, rdamping_coeff2.bt);
    this->avg_sec_par->rdamping_coeff.alpha = GetAverageValue(rdamping_coeff1.alpha, rdamping_coeff2.alpha);
    this->avg_sec_par->artificial_factor_for_shear_damping =
        GetAverageValue(artificial_factor_for_shear_damping1, artificial_factor_for_shear_damping2);

    this->avg_sec_par->phimy =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    this->avg_sec_par->phimz =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    double eps = 0.01;
    if (abs(this->avg_sec_par->GAmyy) > eps) {  // avoid dividing zero
        this->avg_sec_par->phimy = 12.0 * this->avg_sec_par->EImzz / (this->avg_sec_par->GAmyy * LL);
    }
    if (abs(this->avg_sec_par->GAmzz) > eps) {  // avoid dividing zero
        this->avg_sec_par->phimz = 12.0 * this->avg_sec_par->EImyy / (this->avg_sec_par->GAmzz * LL);
    }

    this->avg_sec_par->phiy =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    this->avg_sec_par->phiz =
        0.;  // If the shear stiffness of section is not input by user, the shear deformation effect is ignored
    if (abs(this->avg_sec_par->GAyy) > eps) {  // avoid dividing zero
        this->avg_sec_par->phiy = 12.0 * this->avg_sec_par->EIzz / (this->avg_sec_par->GAyy * LL);
    }
    if (abs(this->avg_sec_par->GAzz) > eps) {  // avoid dividing zero
        this->avg_sec_par->phiz = 12.0 * this->avg_sec_par->EIyy / (this->avg_sec_par->GAzz * LL);
    }
    
    // update the status of lock, to avoid computing again.
    compute_ave_sec_par = true;
}